

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

void png_write_zTXt(png_structrp png_ptr,png_const_charp key,png_const_charp text,int compression)

{
  png_uint_32 pVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  char *error_message;
  uint prefix_len;
  png_byte new_key [81];
  compression_state comp;
  png_byte apStack_488 [88];
  compression_state local_430;
  
  if (compression == 0) {
    pVar1 = png_check_keyword(png_ptr,key,apStack_488);
    if (pVar1 == 0) {
      error_message = "zTXt: invalid keyword";
    }
    else {
      apStack_488[pVar1 + 1] = '\0';
      prefix_len = pVar1 + 2;
      if (text == (png_const_charp)0x0) {
        local_430.input_len = 0;
      }
      else {
        local_430.input_len = strlen(text);
      }
      local_430.output_len = 0;
      local_430.input = (png_const_bytep)text;
      iVar2 = png_text_compress(png_ptr,0x7a545874,&local_430,prefix_len);
      if (iVar2 == 0) {
        png_write_chunk_header(png_ptr,0x7a545874,local_430.output_len + prefix_len);
        png_write_chunk_data(png_ptr,apStack_488,(ulong)prefix_len);
        png_write_compressed_data_out(png_ptr,&local_430);
        png_write_chunk_end(png_ptr);
        return;
      }
      error_message = (png_ptr->zstream).msg;
    }
  }
  else {
    if (compression == -1) {
      png_write_tEXt(png_ptr,key,text,CONCAT44(in_register_0000000c,compression));
      return;
    }
    error_message = "zTXt: invalid compression type";
  }
  png_error(png_ptr,error_message);
}

Assistant:

void /* PRIVATE */
png_write_zTXt(png_structrp png_ptr, png_const_charp key, png_const_charp text,
    int compression)
{
   png_uint_32 key_len;
   png_byte new_key[81];
   compression_state comp;

   png_debug(1, "in png_write_zTXt");

   if (compression == PNG_TEXT_COMPRESSION_NONE)
   {
      png_write_tEXt(png_ptr, key, text, 0);
      return;
   }

   if (compression != PNG_TEXT_COMPRESSION_zTXt)
      png_error(png_ptr, "zTXt: invalid compression type");

   key_len = png_check_keyword(png_ptr, key, new_key);

   if (key_len == 0)
      png_error(png_ptr, "zTXt: invalid keyword");

   /* Add the compression method and 1 for the keyword separator. */
   new_key[++key_len] = PNG_COMPRESSION_TYPE_BASE;
   ++key_len;

   /* Compute the compressed data; do it now for the length */
   png_text_compress_init(&comp, (png_const_bytep)text,
       text == NULL ? 0 : strlen(text));

   if (png_text_compress(png_ptr, png_zTXt, &comp, key_len) != Z_OK)
      png_error(png_ptr, png_ptr->zstream.msg);

   /* Write start of chunk */
   png_write_chunk_header(png_ptr, png_zTXt, key_len + comp.output_len);

   /* Write key */
   png_write_chunk_data(png_ptr, new_key, key_len);

   /* Write the compressed data */
   png_write_compressed_data_out(png_ptr, &comp);

   /* Close the chunk */
   png_write_chunk_end(png_ptr);
}